

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

char * raviT_objtypename(lua_State *L,TValue *o)

{
  TString *key;
  TKey *pTVar1;
  TValue *name;
  Table *mt;
  TValue *o_local;
  lua_State *L_local;
  int nx;
  TValue *k;
  Node *n;
  Node *local_10;
  
  if (o->tt_ == 0x8005) {
    if (o->tt_ != 0x8005) {
      __assert_fail("((((o))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x70,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    if (((o->value_).gc)->tt != '\x05') {
      __assert_fail("(((o)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x70,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    name = *(TValue **)((o->value_).f + 0x28);
    if (name == (TValue *)0x0) goto LAB_0015a7e9;
  }
  else {
LAB_0015a7e9:
    if (o->tt_ == 0x8007) {
      if (o->tt_ != 0x8007) {
        __assert_fail("((((o))->tt_) == (((7) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x71,"const char *raviT_objtypename(lua_State *, const TValue *)");
      }
      if (((o->value_).gc)->tt != '\a') {
        __assert_fail("(((o)->value_).gc)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x71,"const char *raviT_objtypename(lua_State *, const TValue *)");
      }
      name = *(TValue **)((o->value_).f + 0x10);
      if (name != (TValue *)0x0) goto LAB_0015a92d;
    }
    if ((o->tt_ != 0x8015) && (o->tt_ != 0x8025)) goto LAB_0015ab90;
    if ((o->tt_ != 0x8015) && (o->tt_ != 0x8025)) {
      __assert_fail("(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x72,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    if ((((o->value_).gc)->tt != '\x15') && (((o->value_).gc)->tt != '%')) {
      __assert_fail("((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x72,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    name = *(TValue **)((o->value_).f + 0x38);
    if (name == (TValue *)0x0) goto LAB_0015ab90;
  }
LAB_0015a92d:
  key = luaS_new(L,"__name");
  local_10 = (Node *)(*(long *)&name[1].tt_ + (ulong)(key->hash & *(uint *)&name[3].tt_) * 0x20);
  if (key->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar1 = &local_10->i_key;
  if ((local_10->i_key).nk.tt_ == 0x8004) {
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar1->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar1->nk).value_.gc != key) goto LAB_0015aad2;
  }
  else {
LAB_0015aad2:
    if ((local_10->i_key).nk.next == 0) {
      local_10 = (Node *)&luaO_nilobject_;
    }
    else {
      local_10 = (Node *)luaH_getshortstr_continue(key,local_10);
    }
  }
  if (((local_10->i_val).tt_ & 0xf) == 4) {
    if (((local_10->i_val).tt_ & 0xf) != 4) {
      __assert_fail("(((((((name))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x75,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    if ((((local_10->i_val).value_.gc)->tt & 0xf) == 4) {
      return (char *)((local_10->i_val).value_.f + 0x18);
    }
    __assert_fail("(((((name)->value_).gc)->tt) & 0x0F) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                  ,0x75,"const char *raviT_objtypename(lua_State *, const TValue *)");
  }
LAB_0015ab90:
  if (o->tt_ == 0x8015) {
    L_local = (lua_State *)0x1a4ebc;
  }
  else if (o->tt_ == 0x8025) {
    L_local = (lua_State *)0x1a4ec7;
  }
  else {
    L_local = (lua_State *)luaT_typenames_[(int)((o->tt_ & 0xf) + 1)];
  }
  return (char *)L_local;
}

Assistant:

const char *raviT_objtypename(lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttisLtable(o) && (mt = hvalue(o)->metatable) != NULL) ||
    (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL) ||
    (ttisarray(o) && (mt = arrvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  if (ttisiarray(o)) return "integer[]";
  else if (ttisfarray(o)) return "number[]";
  else return ttypename(ttnov(o));  /* else use standard type name */
}